

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

void __thiscall QPlainTextEdit::setDocument(QPlainTextEdit *this,QTextDocument *document)

{
  QPlainTextEditPrivate *this_00;
  QObject *pQVar1;
  long in_FS_OFFSET;
  char local_40 [24];
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPlainTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  if (document == (QTextDocument *)0x0) {
    document = (QTextDocument *)operator_new(0x10);
    QTextDocument::QTextDocument(document,(QObject *)this_00->control);
    pQVar1 = (QObject *)operator_new(0x10);
    QPlainTextDocumentLayout::QPlainTextDocumentLayout((QPlainTextDocumentLayout *)pQVar1,document);
    QTextDocument::setDocumentLayout((QAbstractTextDocumentLayout *)document);
  }
  else {
    pQVar1 = (QObject *)QTextDocument::documentLayout();
    pQVar1 = (QObject *)QtPrivate::qobject_cast_helper<QPlainTextDocumentLayout*,QObject>(pQVar1);
    if (pQVar1 == (QObject *)0x0) {
      local_40[0] = '\x02';
      local_40[1] = '\0';
      local_40[2] = '\0';
      local_40[3] = '\0';
      local_40[0x14] = '\0';
      local_40[0x15] = '\0';
      local_40[0x16] = '\0';
      local_40[0x17] = '\0';
      local_40[4] = '\0';
      local_40[5] = '\0';
      local_40[6] = '\0';
      local_40[7] = '\0';
      local_40[8] = '\0';
      local_40[9] = '\0';
      local_40[10] = '\0';
      local_40[0xb] = '\0';
      local_40[0xc] = '\0';
      local_40[0xd] = '\0';
      local_40[0xe] = '\0';
      local_40[0xf] = '\0';
      local_40[0x10] = '\0';
      local_40[0x11] = '\0';
      local_40[0x12] = '\0';
      local_40[0x13] = '\0';
      local_28 = "default";
      QMessageLogger::warning
                (local_40,
                 "QPlainTextEdit::setDocument: Document set does not support QPlainTextDocumentLayout"
                );
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        return;
      }
      goto LAB_00459a41;
    }
  }
  QWidgetTextControl::setDocument((QWidgetTextControl *)this_00->control,document);
  if (*(long *)(*(long *)(pQVar1 + 8) + 0xb0) == 0) {
    *(QPlainTextEditPrivate **)(*(long *)(pQVar1 + 8) + 0xb0) = this_00;
  }
  QWeakPointer<QObject>::assign<QObject>(&(this_00->documentLayoutPtr).wp,pQVar1);
  QPlainTextEditPrivate::updateDefaultTextOption(this_00);
  QPlainTextEditPrivate::relayoutDocument(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    QPlainTextEditPrivate::adjustScrollbars(this_00);
    return;
  }
LAB_00459a41:
  __stack_chk_fail();
}

Assistant:

void QPlainTextEdit::setDocument(QTextDocument *document)
{
    Q_D(QPlainTextEdit);
    QPlainTextDocumentLayout *documentLayout = nullptr;

    if (!document) {
        document = new QTextDocument(d->control);
        documentLayout = new QPlainTextDocumentLayout(document);
        document->setDocumentLayout(documentLayout);
    } else {
        documentLayout = qobject_cast<QPlainTextDocumentLayout*>(document->documentLayout());
        if (Q_UNLIKELY(!documentLayout)) {
            qWarning("QPlainTextEdit::setDocument: Document set does not support QPlainTextDocumentLayout");
            return;
        }
    }
    d->control->setDocument(document);
    if (!documentLayout->priv()->mainViewPrivate)
        documentLayout->priv()->mainViewPrivate = d;
    d->documentLayoutPtr = documentLayout;
    d->updateDefaultTextOption();
    d->relayoutDocument();
    d->adjustScrollbars();
}